

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_eval_binary(JSContext *ctx,uint8_t *buf,size_t buf_len,int load_only)

{
  JSValue v;
  JSValue fun_obj;
  JSValue v_00;
  int iVar1;
  int in_ECX;
  JSValue JVar2;
  int in_stack_0000000c;
  size_t in_stack_00000010;
  uint8_t *in_stack_00000018;
  JSContext *in_stack_00000020;
  JSValue val;
  JSValue obj;
  int in_stack_00001038;
  int in_stack_0000103c;
  JSContext *in_stack_00001040;
  JSValue in_stack_00001048;
  JSContext *in_stack_ffffffffffffff98;
  JSValueUnion in_stack_ffffffffffffffa0;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion JVar3;
  JSValueUnion ctx_01;
  
  JVar2 = JS_ReadObject(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c);
  ctx_01 = JVar2.u;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      if ((int)JVar2.tag == -3) {
        JVar2.tag = (int64_t)in_stack_ffffffffffffffa8.ptr;
        JVar2.u.ptr = in_stack_ffffffffffffffa0.ptr;
        iVar1 = JS_ResolveModule(in_stack_ffffffffffffff98,JVar2);
        if (iVar1 < 0) {
          v.tag = (int64_t)ctx_01.ptr;
          v.u.ptr = in_stack_ffffffffffffffa8.ptr;
          JS_FreeValue((JSContext *)in_stack_ffffffffffffffa0.ptr,v);
          goto LAB_0010e554;
        }
        js_module_set_import_meta
                  (in_stack_00001040,in_stack_00001048,in_stack_0000103c,in_stack_00001038);
      }
      fun_obj.tag = (int64_t)ctx_01.ptr;
      fun_obj.u.ptr = in_stack_ffffffffffffffa8.ptr;
      JVar2 = JS_EvalFunction((JSContext *)in_stack_ffffffffffffffa0.ptr,fun_obj);
      ctx_00 = JVar2.u;
      JVar3 = (JSValueUnion)JVar2.tag;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) goto LAB_0010e554;
      v_00.tag = (int64_t)ctx_01.ptr;
      v_00.u.float64 = JVar3.float64;
      JS_FreeValue((JSContext *)ctx_00.ptr,v_00);
    }
    else if ((int)JVar2.tag == -3) {
      js_module_set_import_meta
                (in_stack_00001040,in_stack_00001048,in_stack_0000103c,in_stack_00001038);
    }
    return;
  }
LAB_0010e554:
  js_std_dump_error((JSContext *)ctx_01.ptr);
  exit(1);
}

Assistant:

void js_std_eval_binary(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                        int load_only)
{
    JSValue obj, val;
    obj = JS_ReadObject(ctx, buf, buf_len, JS_READ_OBJ_BYTECODE);
    if (JS_IsException(obj))
        goto exception;
    if (load_only) {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
            js_module_set_import_meta(ctx, obj, FALSE, FALSE);
        }
    } else {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
            if (JS_ResolveModule(ctx, obj) < 0) {
                JS_FreeValue(ctx, obj);
                goto exception;
            }
            js_module_set_import_meta(ctx, obj, FALSE, TRUE);
        }
        val = JS_EvalFunction(ctx, obj);
        if (JS_IsException(val)) {
        exception:
            js_std_dump_error(ctx);
            exit(1);
        }
        JS_FreeValue(ctx, val);
    }
}